

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O0

bool __thiscall teetime::Image::saveToFile(Image *this,string *filename,ImageFileFormat format)

{
  ImageFileFormat format_local;
  string *filename_local;
  Image *this_local;
  
  if (format == Png) {
    this_local._7_1_ = saveToPngFile(this,filename);
  }
  else if (format == Tga) {
    this_local._7_1_ = saveToTgaFile(this,filename);
  }
  else if (format == Bmp) {
    this_local._7_1_ = saveToBmpFile(this,filename);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Image::saveToFile(const std::string& filename, ImageFileFormat format) const
{
  switch (format)
  {
  case ImageFileFormat::Tga:
    return saveToTgaFile(filename);
  case ImageFileFormat::Bmp:
    return saveToBmpFile(filename);
  case ImageFileFormat::Png:
    return saveToPngFile(filename);
  default:
    return false;
  }
}